

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.h
# Opt level: O0

int32_t __thiscall icu_63::UnicodeString::indexOf(UnicodeString *this,char16_t c,int32_t start)

{
  UChar c_00;
  int32_t iVar1;
  int32_t iVar2;
  int32_t local_18;
  UChar local_12;
  int32_t start_local;
  char16_t c_local;
  UnicodeString *this_local;
  
  local_18 = start;
  local_12 = c;
  _start_local = this;
  pinIndex(this,&local_18);
  c_00 = local_12;
  iVar2 = local_18;
  iVar1 = length(this);
  iVar2 = doIndexOf(this,c_00,iVar2,iVar1 - local_18);
  return iVar2;
}

Assistant:

inline int32_t
UnicodeString::indexOf(char16_t c,
               int32_t start) const {
  pinIndex(start);
  return doIndexOf(c, start, length() - start);
}